

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

int __thiscall common_log::pause(common_log *this)

{
  reference pvVar1;
  ulong uVar2;
  size_type sVar3;
  bool bVar4;
  value_type *entry;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffd0;
  uint local_14;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  bVar4 = (this->running & 1U) != 0;
  if (bVar4) {
    this->running = false;
    pvVar1 = std::vector<common_log_entry,_std::allocator<common_log_entry>_>::operator[]
                       (&this->entries,this->tail);
    pvVar1->is_end = true;
    uVar2 = this->tail + 1;
    sVar3 = std::vector<common_log_entry,_std::allocator<common_log_entry>_>::size(&this->entries);
    this->tail = uVar2 % sVar3;
    std::condition_variable::notify_one();
  }
  local_14 = (uint)!bVar4;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x359ace);
  if (local_14 == 0) {
    local_14 = std::thread::join();
  }
  return local_14;
}

Assistant:

void pause() {
        {
            std::lock_guard<std::mutex> lock(mtx);

            if (!running) {
                return;
            }

            running = false;

            // push an entry to signal the worker thread to stop
            {
                auto & entry = entries[tail];
                entry.is_end = true;

                tail = (tail + 1) % entries.size();
            }

            cv.notify_one();
        }

        thrd.join();
    }